

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureDescription::SerializeWithCachedSizes
          (FeatureDescription *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  string *psVar5;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FeatureDescription *this_local;
  
  name_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.FeatureDescription.name");
    psVar5 = name_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar5,output);
  }
  shortdescription_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    shortdescription_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    shortdescription_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.FeatureDescription.shortDescription");
    psVar5 = shortdescription_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,psVar5,output);
  }
  bVar1 = has_type(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->type_->super_MessageLite,output);
  }
  return;
}

Assistant:

void FeatureDescription::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureDescription)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureDescription.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // string shortDescription = 2;
  if (this->shortdescription().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->shortdescription().data(), this->shortdescription().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureDescription.shortDescription");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->shortdescription(), output);
  }

  // .CoreML.Specification.FeatureType type = 3;
  if (this->has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->type_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureDescription)
}